

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_8,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  bool bVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  int col_1;
  int col;
  long lVar6;
  float v;
  float fVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  float local_58;
  float local_54;
  Type in1;
  float local_44 [3];
  Type in0;
  int aiStack_18 [6];
  long lVar9;
  
  pfVar1 = in0.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    pfVar3 = (float *)&in0;
    bVar10 = true;
    do {
      bVar2 = bVar10;
      lVar6 = 0;
      auVar8 = _DAT_00a99400;
      do {
        bVar10 = SUB164(auVar8 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar10) {
          fVar7 = 1.0;
          if (lVar4 != lVar6) {
            fVar7 = 0.0;
          }
          pfVar3[lVar6 * 2] = fVar7;
        }
        if (bVar10) {
          fVar7 = 1.0;
          if (lVar4 + -1 != lVar6) {
            fVar7 = 0.0;
          }
          pfVar3[lVar6 * 2 + 2] = fVar7;
        }
        lVar6 = lVar6 + 2;
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
      } while (lVar6 != 4);
      lVar4 = 1;
      pfVar3 = pfVar1;
      bVar10 = false;
    } while (bVar2);
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in0.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    lVar4 = 0;
    pfVar3 = (float *)&in0;
    bVar10 = true;
    do {
      bVar2 = bVar10;
      lVar6 = 0;
      do {
        pfVar3[lVar6 * 2] =
             *(float *)((long)&sr::(anonymous_namespace)::s_constInMat3x2 + lVar4 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar4 = 0xc;
      pfVar3 = pfVar1;
      bVar10 = false;
    } while (bVar2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    in1.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    in1.m_data[2] = (evalCtx->coords).m_data[2];
  }
  else {
    in1.m_data[0] = -0.2;
    in1.m_data[1] = 0.5;
    in1.m_data[2] = 0.8;
  }
  pfVar3 = &local_54;
  pfVar5 = (float *)&in0;
  bVar10 = true;
  do {
    bVar2 = bVar10;
    fVar7 = 0.0;
    lVar4 = 0;
    do {
      fVar7 = fVar7 + pfVar5[lVar4 * 2] * in1.m_data[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    *pfVar3 = fVar7;
    pfVar3 = &local_58;
    pfVar5 = pfVar1;
    bVar10 = false;
  } while (bVar2);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar4]] = in1.m_data[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}